

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O3

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadGeometryVertexBuffer
          (OgreBinarySerializer *this,VertexData *dest)

{
  int8_t *__src;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined1 auVar1 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  unsigned_short source;
  unsigned_short uVar3;
  unsigned_short uVar4;
  uint uVar5;
  uint32_t uVar6;
  uint8_t *__dest;
  mapped_type *pmVar7;
  Logger *this_01;
  runtime_error *prVar8;
  ulong __n;
  uint16_t bindIndex;
  unsigned_short local_1ca;
  long *local_1c8;
  long local_1b8 [2];
  undefined1 local_1a8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1a0;
  undefined1 local_198 [96];
  ios_base local_138 [272];
  
  source = StreamReader<false,_false>::Get<unsigned_short>(this->m_reader);
  local_1ca = source;
  uVar3 = StreamReader<false,_false>::Get<unsigned_short>(this->m_reader);
  uVar4 = StreamReader<false,_false>::Get<unsigned_short>(this->m_reader);
  uVar5 = StreamReader<false,_false>::Get<unsigned_int>(this->m_reader);
  this->m_currentLen = uVar5;
  if (uVar4 != 0x5210) {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1a8 = (undefined1  [8])local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,
               "M_GEOMETRY_VERTEX_BUFFER_DATA not found in M_GEOMETRY_VERTEX_BUFFER","");
    std::runtime_error::runtime_error(prVar8,(string *)local_1a8);
    *(undefined ***)prVar8 = &PTR__runtime_error_0080bf48;
    __cxa_throw(prVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar6 = VertexData::VertexSize(dest,source);
  if (uVar6 == uVar3) {
    __n = (ulong)(uVar6 * (dest->super_IVertexData).count);
    __dest = (uint8_t *)operator_new__(__n);
    __src = this->m_reader->current;
    StreamReader<false,_false>::SetPtr(this->m_reader,__src + __n);
    memcpy(__dest,__src,__n);
    local_1a8 = (undefined1  [8])Intern::AllocateFromAssimpHeap::operator_new(0x28);
    (((MemoryIOStream *)local_1a8)->super_IOStream)._vptr_IOStream =
         (_func_int **)&PTR__MemoryIOStream_0080b9e8;
    ((MemoryIOStream *)local_1a8)->buffer = __dest;
    ((MemoryIOStream *)local_1a8)->length = __n;
    ((MemoryIOStream *)local_1a8)->pos = 0;
    ((MemoryIOStream *)local_1a8)->own = true;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Assimp::MemoryIOStream*>
              (&_Stack_1a0,(MemoryIOStream *)local_1a8);
    pmVar7 = std::
             map<unsigned_short,_std::shared_ptr<Assimp::MemoryIOStream>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::shared_ptr<Assimp::MemoryIOStream>_>_>_>
             ::operator[](&dest->vertexBindings,&local_1ca);
    _Var2._M_pi = _Stack_1a0._M_pi;
    auVar1 = local_1a8;
    local_1a8 = (undefined1  [8])0x0;
    _Stack_1a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (pmVar7->super___shared_ptr<Assimp::MemoryIOStream,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
    (pmVar7->super___shared_ptr<Assimp::MemoryIOStream,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)auVar1;
    (pmVar7->super___shared_ptr<Assimp::MemoryIOStream,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
    _M_pi = _Var2._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if (_Stack_1a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1a0._M_pi);
    }
    this_01 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[37]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
               (char (*) [37])"    - Read vertex buffer for source ");
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," of ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," bytes",6);
    std::__cxx11::stringbuf::str();
    Logger::debug(this_01,(char *)local_1c8);
    if (local_1c8 != local_1b8) {
      operator_delete(local_1c8,local_1b8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    return;
  }
  prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_1a8 = (undefined1  [8])local_198;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,
             "Vertex buffer size does not agree with vertex declaration in M_GEOMETRY_VERTEX_BUFFER"
             ,"");
  std::runtime_error::runtime_error(prVar8,(string *)local_1a8);
  *(undefined ***)prVar8 = &PTR__runtime_error_0080bf48;
  __cxa_throw(prVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void OgreBinarySerializer::ReadGeometryVertexBuffer(VertexData *dest)
{
    uint16_t bindIndex = Read<uint16_t>();
    uint16_t vertexSize = Read<uint16_t>();

    uint16_t id = ReadHeader();
    if (id != M_GEOMETRY_VERTEX_BUFFER_DATA)
        throw DeadlyImportError("M_GEOMETRY_VERTEX_BUFFER_DATA not found in M_GEOMETRY_VERTEX_BUFFER");

    if (dest->VertexSize(bindIndex) != vertexSize)
        throw DeadlyImportError("Vertex buffer size does not agree with vertex declaration in M_GEOMETRY_VERTEX_BUFFER");

    size_t numBytes = dest->count * vertexSize;
    uint8_t *vertexBuffer = ReadBytes(numBytes);
    dest->vertexBindings[bindIndex] = MemoryStreamPtr(new Assimp::MemoryIOStream(vertexBuffer, numBytes, true));

    ASSIMP_LOG_DEBUG_F( "    - Read vertex buffer for source ", bindIndex, " of ", numBytes, " bytes");
}